

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O3

void do_cmd_note(void)

{
  _Bool _Var1;
  char *fmt;
  undefined1 *puVar2;
  char tmp [70];
  char note [90];
  undefined4 local_c8;
  char local_c4;
  undefined1 local_c3 [75];
  char local_78 [3];
  undefined1 local_75 [101];
  
  my_strcpy((char *)&local_c8,"",0x46);
  my_strcpy(local_78,"",0x5a);
  _Var1 = get_string("Note: ",(char *)&local_c8,0x46);
  if (!_Var1) {
    return;
  }
  if ((local_c8 & 0xdf) == 0) {
    return;
  }
  if (local_c4 == ' ' && local_c8 == 0x7961732f) {
    puVar2 = local_c3;
    fmt = "-- %s says: \"%s\"";
  }
  else {
    if (local_c8._2_1_ != 'e' || (short)local_c8 != 0x6d2f) {
      strnfmt(local_78,0x5a,"-- Note: %s",&local_c8);
      goto LAB_00130aae;
    }
    puVar2 = (undefined1 *)((long)&local_c8 + 3);
    fmt = "-- %s%s";
  }
  strnfmt(local_78,0x5a,fmt,player->full_name,puVar2);
LAB_00130aae:
  msg("%s",local_75);
  history_add(player,local_78,L'\a');
  return;
}

Assistant:

void do_cmd_note(void)
{
	/* Allocate/Initialize strings to get and format user input. */
	char tmp[70];
	char note[90];
	my_strcpy(tmp, "", sizeof(tmp));
	my_strcpy(note, "", sizeof(note));

	/* Read a line of input from the user */
	if (!get_string("Note: ", tmp, sizeof(tmp))) return;

	/* Ignore empty notes */
	if (!tmp[0] || (tmp[0] == ' ')) return;

	/* Format the note correctly, supporting some cute /me commands */
	if (strncmp(tmp, "/say ", 5) == 0)
		strnfmt(note, sizeof(note), "-- %s says: \"%s\"", player->full_name,
				&tmp[5]);
	else if (strncmp(tmp, "/me", 3) == 0)
		strnfmt(note, sizeof(note), "-- %s%s", player->full_name, &tmp[3]);
	else
		strnfmt(note, sizeof(note), "-- Note: %s", tmp);

	/* Display the note (omitting the "-- " prefix) */
	msg("%s", &note[3]);

	/* Add a history entry */
	history_add(player, note, HIST_USER_INPUT);
}